

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void get_ls_tile_buffer(uint8_t *data_end,aom_internal_error_info *error_info,uint8_t **data,
                       TileBufferDec (*tile_buffers) [64],int tile_size_bytes,int col,int row,
                       int tile_copy_mode)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t *src;
  uint8_t *puVar6;
  
  src = *data;
  lVar3 = (long)tile_size_bytes;
  if ((ulong)((long)data_end - (long)src) <= lVar3 - 1U) {
    aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile length")
    ;
    src = *data;
  }
  sVar2 = mem_get_varsize(src,tile_size_bytes);
  if ((tile_copy_mode == 0) ||
     (cVar1 = (char)(tile_size_bytes << 3), sVar2 >> (cVar1 - 1U & 0x3f) != 1)) {
    uVar5 = sVar2 + 1;
    puVar6 = src + lVar3;
    *data = puVar6;
    sVar2 = uVar5;
    if ((ulong)((long)data_end - (long)puVar6) < uVar5) {
      aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile size")
      ;
      puVar6 = *data;
    }
    else if (uVar5 == 0) {
      puVar6 = (uint8_t *)0x0;
      sVar2 = 0;
      uVar5 = 0;
    }
  }
  else {
    uVar4 = (uint)(sVar2 >> (cVar1 - 8U & 0x3f)) & 0x7f;
    if (row < (int)uVar4) {
      aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,
                         "Invalid row offset in tile copy mode: row=%d offset=%d",(ulong)(uint)row,
                         (ulong)uVar4);
      src = *data;
    }
    puVar6 = tile_buffers[(int)(row - uVar4)][col].data;
    sVar2 = tile_buffers[(int)(row - uVar4)][col].size;
    *data = src + lVar3;
    uVar5 = 0;
  }
  tile_buffers[row][col].data = puVar6;
  tile_buffers[row][col].size = sVar2;
  *data = *data + uVar5;
  return;
}

Assistant:

static inline void get_ls_tile_buffer(
    const uint8_t *const data_end, struct aom_internal_error_info *error_info,
    const uint8_t **data, TileBufferDec (*const tile_buffers)[MAX_TILE_COLS],
    int tile_size_bytes, int col, int row, int tile_copy_mode) {
  size_t size;

  size_t copy_size = 0;
  const uint8_t *copy_data = NULL;

  if (!read_is_valid(*data, tile_size_bytes, data_end))
    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile length");
  size = mem_get_varsize(*data, tile_size_bytes);

  // If tile_copy_mode = 1, then the top bit of the tile header indicates copy
  // mode.
  if (tile_copy_mode && (size >> (tile_size_bytes * 8 - 1)) == 1) {
    // The remaining bits in the top byte signal the row offset
    int offset = (size >> (tile_size_bytes - 1) * 8) & 0x7f;
    if (offset > row) {
      aom_internal_error(
          error_info, AOM_CODEC_CORRUPT_FRAME,
          "Invalid row offset in tile copy mode: row=%d offset=%d", row,
          offset);
    }

    // Currently, only use tiles in same column as reference tiles.
    copy_data = tile_buffers[row - offset][col].data;
    copy_size = tile_buffers[row - offset][col].size;
    size = 0;
  } else {
    size += AV1_MIN_TILE_SIZE_BYTES;
  }

  *data += tile_size_bytes;

  if (size > (size_t)(data_end - *data))
    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile size");

  if (size > 0) {
    tile_buffers[row][col].data = *data;
    tile_buffers[row][col].size = size;
  } else {
    tile_buffers[row][col].data = copy_data;
    tile_buffers[row][col].size = copy_size;
  }

  *data += size;
}